

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O1

shared_ptr<duckdb::CheckpointLock,_true> __thiscall
duckdb::DuckTransaction::SharedLockTable(DuckTransaction *this,DataTableInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar1 [8];
  int iVar2;
  __node_base_ptr p_Var3;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_true>
  _Var4;
  pthread_mutex_t *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  DataTableInfo *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CheckpointLock *__tmp;
  pointer *__ptr;
  __hash_code __code;
  pair<std::__detail::_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_false,_true>,_bool>
  pVar5;
  shared_ptr<duckdb::CheckpointLock,_true> sVar6;
  unique_lock<std::mutex> transaction_lock;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  ActiveTableLock *local_40;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = (mutex_type *)&info[1].schema._M_string_length;
  local_38._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  this_00 = &info[1].table.field_2;
  local_50 = (undefined1  [8])in_RDX;
  p_Var3 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::DataTableInfo>,_std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTableInfo>,_duckdb::ReferenceHashFunction<duckdb::DataTableInfo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<std::reference_wrapper<duckdb::DataTableInfo>,_std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTableInfo>,_duckdb::ReferenceHashFunction<duckdb::DataTableInfo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this_00,(ulong)in_RDX % *(ulong *)((long)&info[1].table.field_2 + 8),
                      (key_type *)local_50,(__hash_code)in_RDX);
  if (p_Var3 == (__node_base_ptr)0x0) {
    _Var4._M_cur = (__node_type *)0x0;
  }
  else {
    _Var4._M_cur = (__node_type *)p_Var3->_M_nxt;
  }
  if (_Var4._M_cur == (__node_type *)0x0) {
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    (((ActiveTableLock *)local_48._M_pi)->checkpoint_lock_mutex).super___mutex_base._M_mutex.__data.
    __list.__next = (__pthread_internal_list *)0x0;
    (((ActiveTableLock *)local_48._M_pi)->checkpoint_lock).internal.
    super___weak_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    *(undefined8 *)
     ((long)&(((ActiveTableLock *)local_48._M_pi)->checkpoint_lock_mutex).super___mutex_base.
             _M_mutex + 0x10) = 0;
    (((ActiveTableLock *)local_48._M_pi)->checkpoint_lock_mutex).super___mutex_base._M_mutex.__data.
    __list.__prev = (__pthread_internal_list *)0x0;
    (((ActiveTableLock *)local_48._M_pi)->checkpoint_lock_mutex).super___mutex_base._M_mutex.__align
         = 0;
    *(undefined8 *)
     ((long)&(((ActiveTableLock *)local_48._M_pi)->checkpoint_lock_mutex).super___mutex_base.
             _M_mutex + 8) = 0;
    (((ActiveTableLock *)local_48._M_pi)->checkpoint_lock).internal.
    super___weak_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40 = (ActiveTableLock *)0x0;
    local_50 = (undefined1  [8])in_RDX;
    pVar5 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::DataTableInfo>,std::pair<std::reference_wrapper<duckdb::DataTableInfo>const,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>,std::allocator<std::pair<std::reference_wrapper<duckdb::DataTableInfo>const,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::DataTableInfo>,duckdb::ReferenceHashFunction<duckdb::DataTableInfo>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::pair<duckdb::DataTableInfo&,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>>
                      ((_Hashtable<std::reference_wrapper<duckdb::DataTableInfo>,std::pair<std::reference_wrapper<duckdb::DataTableInfo>const,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>,std::allocator<std::pair<std::reference_wrapper<duckdb::DataTableInfo>const,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::DataTableInfo>,duckdb::ReferenceHashFunction<duckdb::DataTableInfo>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this_00,local_50);
    _Var4._M_cur = (__node_type *)
                   pVar5.first.
                   super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_true>
                   ._M_cur;
    if ((ActiveTableLock *)local_48._M_pi != (ActiveTableLock *)0x0) {
      ::std::default_delete<duckdb::DuckTransaction::ActiveTableLock>::operator()
                ((default_delete<duckdb::DuckTransaction::ActiveTableLock> *)&local_48,
                 (ActiveTableLock *)local_48._M_pi);
    }
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_40 != (ActiveTableLock *)0x0) {
      ::std::default_delete<duckdb::DuckTransaction::ActiveTableLock>::operator()
                ((default_delete<duckdb::DuckTransaction::ActiveTableLock> *)&local_40,local_40);
    }
  }
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>
            ::operator*((unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>
                         *)((long)&((_Var4._M_cur)->
                                   super__Hash_node_value<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>_>
                                   ._M_storage._M_storage + 8));
  ::std::unique_lock<std::mutex>::unlock(&local_38);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    weak_ptr<duckdb::CheckpointLock,_true>::lock((weak_ptr<duckdb::CheckpointLock,_true> *)this);
    if ((this->super_Transaction)._vptr_Transaction == (_func_int **)0x0) {
      StorageLock::GetSharedLock((StorageLock *)local_50);
      this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      auVar1 = local_50;
      this_02->_M_use_count = 1;
      this_02->_M_weak_count = 1;
      this_02->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_019aa1d8;
      local_50 = (undefined1  [8])0x0;
      this_02[1]._vptr__Sp_counted_base = (_func_int **)auVar1;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = 2;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      (this->super_Transaction)._vptr_Transaction = (_func_int **)(this_02 + 1);
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->super_Transaction).manager;
      (this->super_Transaction).manager = (TransactionManager *)this_02;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      auVar1 = local_50;
      if (local_50 != (undefined1  [8])0x0) {
        StorageLockKey::~StorageLockKey((StorageLockKey *)local_50);
        operator_delete((void *)auVar1);
      }
      __mutex[1].__align = (long)(this->super_Transaction)._vptr_Transaction;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)__mutex + 0x30),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Transaction).manager);
    }
    pthread_mutex_unlock(__mutex);
    ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
    sVar6.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar6.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::CheckpointLock,_true>)
           sVar6.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

shared_ptr<CheckpointLock> DuckTransaction::SharedLockTable(DataTableInfo &info) {
	unique_lock<mutex> transaction_lock(active_locks_lock);
	auto entry = active_locks.find(info);
	if (entry == active_locks.end()) {
		entry = active_locks.insert(entry, make_pair(std::ref(info), make_uniq<ActiveTableLock>()));
	}
	auto &active_table_lock = *entry->second;
	transaction_lock.unlock(); // release transaction-level lock before acquiring table-level lock
	lock_guard<mutex> table_lock(active_table_lock.checkpoint_lock_mutex);
	auto checkpoint_lock = active_table_lock.checkpoint_lock.lock();
	// check if it is expired (or has never been acquired yet)
	if (checkpoint_lock) {
		// not expired - return it
		return checkpoint_lock;
	}
	// no existing lock - obtain it
	checkpoint_lock = make_shared_ptr<CheckpointLock>(info.GetSharedLock());
	// store it for future reference
	active_table_lock.checkpoint_lock = checkpoint_lock;
	return checkpoint_lock;
}